

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall
CVmRun::op_overload(CVmRun *this,uint caller_ofs,int asi_lcl,vm_val_t *obj,vm_prop_id_t prop,
                   uint argc,int err)

{
  undefined4 uVar1;
  int iVar2;
  uchar *puVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  vm_obj_id_t *in_RDI;
  short in_R8W;
  uint in_R9D;
  uchar *ret;
  int is_call;
  vm_val_t new_self;
  vm_obj_id_t srcobj;
  vm_val_t val;
  undefined1 *idx;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vm_val_t **in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 uVar6;
  vm_prop_id_t in_stack_ffffffffffffffae;
  undefined2 uVar7;
  uint in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  CVmRun *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  vm_val_t *in_stack_ffffffffffffffd0;
  uint argc_00;
  
  if (in_R8W == 0) {
    err_throw(0);
  }
  iVar2 = *in_RCX;
  if (((iVar2 != 5) && (iVar2 != 8)) && (iVar2 != 10)) {
    err_throw(0);
  }
  idx = &stack0xffffffffffffffb0;
  iVar2 = get_prop_no_eval((vm_val_t **)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffae,in_stack_ffffffffffffffa0,in_RDI,
                           (vm_val_t *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88,
                           (vm_val_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                          );
  argc_00 = (uint)in_RCX;
  if (iVar2 == 0) {
    err_throw(0);
  }
  uVar6 = 0;
  uVar7 = 0;
  if (((local_38 == 0xb) || (local_38 == 9)) || (local_38 == 0x11)) {
    uVar6 = 1;
    uVar7 = 0;
    if (in_ESI != 0) {
      if (in_EDX < 0) {
        CVmStack::insert((CVmStack *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (size_t)idx,0x22eae2);
        pvVar4 = CVmStack::get((ulong)in_R9D);
        vm_val_t::set_int(pvVar4,in_ESI);
        in_ESI = 1;
      }
      else {
        CVmStack::insert((CVmStack *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (size_t)idx,0x22eb1e);
        pvVar4 = CVmStack::get((ulong)(in_R9D + 1));
        vm_val_t::set_int(pvVar4,in_ESI);
        pvVar4 = CVmStack::get((ulong)in_R9D);
        vm_val_t::set_int(pvVar4,in_EDX);
        in_ESI = 2;
      }
    }
  }
  puVar3 = eval_prop_val(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb0,
                         (vm_val_t *)CONCAT26(uVar7,CONCAT24(uVar6,in_stack_ffffffffffffffa8)),
                         (vm_obj_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                         (vm_prop_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x10),
                         in_stack_ffffffffffffffd0,in_R9D,argc_00,
                         (vm_rcdesc *)CONCAT44(in_ESI,in_EDX));
  if ((CONCAT22(uVar7,uVar6) == 0) && (in_ESI != 0)) {
    if (in_EDX < 0) {
      pvVar4 = get_r0();
      CVmStack::push(pvVar4);
    }
    else {
      pvVar4 = get_r0();
      pvVar5 = get_local(0);
      uVar1 = *(undefined4 *)&pvVar4->field_0x4;
      pvVar5->typ = pvVar4->typ;
      *(undefined4 *)&pvVar5->field_0x4 = uVar1;
      pvVar5->val = pvVar4->val;
    }
  }
  return puVar3;
}

Assistant:

const uchar *CVmRun::op_overload(VMG_ uint caller_ofs, int asi_lcl,
                                 const vm_val_t *obj, vm_prop_id_t prop,
                                 uint argc, int err)
{
    vm_val_t val;
    vm_obj_id_t srcobj;
    vm_val_t new_self;

    /* 
     *   if the program defines any overloads for the operator, it must
     *   define the export property; so if the export property isn't defined,
     *   we can't have any overloading for the operator 
     */
    if (prop == VM_INVALID_PROP)
        err_throw(err);

    /* 
     *   if the value isn't an object, list, or string, there's no property,
     *   so throw the specified error 
     */
    switch (obj->typ)
    {
    case VM_OBJ:
    case VM_SSTRING:
    case VM_LIST:
        /* these can have property values - look it up */
        if (get_prop_no_eval(vmg_ &obj, prop, &argc, &srcobj, &val,
                             &obj, &new_self))
        {
            /* presume this is not actually a procedure call */
            int is_call = FALSE;
            
            /* 
             *   Got it.  Set up the appropriate special local subroutine for
             *   processing the return value.
             *   
             *   - For a recursive call, the caller will provide the special
             *   handling on return, so there's nothing special to do.
             *   
             *   - If there's no local to assign, we simply push the value
             *   onto the stack on return, then do a local return to the
             *   actual caller.  Push our return offset as the local return
             *   address.
             *   
             *   - If there's a local, we assign the value to the local on
             *   return.  Push the return offset as the local return address,
             *   and push the local number after that.  
             */
            if (val.typ == VM_CODEOFS
                || val.typ == VM_DSTRING
                || val.typ == VM_OBJX)
            {
                /* 
                 *   These will all result in subroutine calls.  Set up the
                 *   return frame patch accordingly. 
                 */
                is_call = TRUE;
                if (caller_ofs == 0)
                {
                    /* 
                     *   this is a recursive call - no return processing
                     *   patch is required 
                     */
                }
                else if (asi_lcl < 0)
                {
                    /* open one stack slot above the arguments */
                    insert(argc, 1);
                    
                    /* on return, push the value onto the stack */
                    get(argc)->set_int(caller_ofs);
                    caller_ofs = VMRUN_RET_OP;
                }
                else
                {
                    /* open two stack slots above the arguments */
                    insert(argc, 2);
                    
                    /* on return, store the value in locl #asi_lcl */
                    get(argc + 1)->set_int(caller_ofs);
                    get(argc)->set_int(asi_lcl);
                    caller_ofs = VMRUN_RET_OP_ASILCL;
                }
            }
                
            /* evaluate the property */
            const uchar *ret = eval_prop_val(
                vmg_ TRUE, caller_ofs, &val, obj->val.obj, prop,
                obj, srcobj, argc, 0);

            /* if this is a direct evaluation, do the return patch now */
            if (!is_call)
            {
                if (caller_ofs == 0)
                {
                    /* recursive call - the caller will take care of it */
                }
                else if (asi_lcl < 0)
                {
                    /* normal operator eval - push the result onto the stack */
                    push(get_r0());
                }
                else
                {
                    /* local assignment on return */
                    *get_local(vmg_ asi_lcl) = *get_r0();
                }
            }

            /* return the result */
            return ret;
        }

        /* the property isn't defined - throw the caller's error */
        err_throw(err);
        AFTER_ERR_THROW(return 0;)

    default:
        /* other types don't have properties - throw the caller's error */
        err_throw(err);
        AFTER_ERR_THROW(return 0;)
    }
}